

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

rrb<char,_false,_6> *
immutable::rrb_details::rrb_tail_push<char,false,6>
          (ref<immutable::rrb<char,_false,_6>_> *in,char element)

{
  uint32_t *puVar1;
  size_t __size;
  uint32_t uVar2;
  rrb<char,_false,_6> *prVar3;
  tree_node<char,_false> *ptVar4;
  leaf_node<char,_false> *plVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  leaf_node<char,_false> *__s;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ref<immutable::rrb_details::leaf_node<char,_false>_> *this;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_40;
  rrb<char,_false,_6> *local_38;
  
  prVar3 = in->ptr;
  local_38 = (rrb<char,_false,_6> *)malloc(0x28);
  uVar2 = prVar3->cnt;
  uVar6 = prVar3->shift;
  uVar7 = prVar3->tail_len;
  uVar8 = *(undefined4 *)&prVar3->field_0xc;
  ptVar4 = (prVar3->root).ptr;
  (local_38->tail).ptr = (prVar3->tail).ptr;
  (local_38->root).ptr = ptVar4;
  local_38->cnt = uVar2;
  local_38->shift = uVar6;
  local_38->tail_len = uVar7;
  *(undefined4 *)&local_38->field_0xc = uVar8;
  uVar8 = *(undefined4 *)&prVar3->field_0x24;
  local_38->_ref_count = prVar3->_ref_count;
  *(undefined4 *)&local_38->field_0x24 = uVar8;
  ptVar4 = (local_38->root).ptr;
  if (ptVar4 != (tree_node<char,_false> *)0x0) {
    puVar1 = &ptVar4->_ref_count;
    *puVar1 = *puVar1 + 1;
  }
  plVar5 = (local_38->tail).ptr;
  if (plVar5 != (leaf_node<char,_false> *)0x0) {
    puVar1 = &plVar5->_ref_count;
    *puVar1 = *puVar1 + 1;
  }
  if (prVar3 != (rrb<char,_false,_6> *)0x0) {
    this = &local_38->tail;
    plVar5 = (prVar3->tail).ptr;
    uVar11 = plVar5->len + 1;
    __size = (ulong)uVar11 + 0x18;
    __s = (leaf_node<char,_false> *)malloc(__size);
    memset(__s,0,__size);
    prVar3 = local_38;
    __s->len = uVar11;
    __s->type = LEAF_NODE;
    __s->child = (char *)(__s + 1);
    __s->guid = 0;
    uVar9 = (ulong)plVar5->len;
    if (plVar5->len != 0) {
      uVar10 = 0;
      do {
        __s->child[uVar10] = plVar5->child[uVar10];
        uVar10 = uVar10 + 1;
        uVar9 = (ulong)plVar5->len;
      } while (uVar10 < uVar9);
    }
    __s->child[uVar9] = '\0';
    __s->child[local_38->tail_len] = element;
    local_38->cnt = local_38->cnt + 1;
    local_38->tail_len = local_38->tail_len + 1;
    __s->_ref_count = 1;
    local_40.ptr = __s;
    ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=(this,&local_40);
    if ((local_40.ptr != (leaf_node<char,_false> *)0x0) &&
       (uVar2 = (local_40.ptr)->_ref_count, (local_40.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
      free(local_40.ptr);
    }
    return prVar3;
  }
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,
                "T *immutable::ref<immutable::rrb<char, false, 6>>::operator->() const [T = immutable::rrb<char, false, 6>]"
               );
}

Assistant:

inline rrb<T, atomic_ref_counting, N>* rrb_tail_push(const ref<rrb<T, atomic_ref_counting, N>>& in, T element)
      {
      rrb<T, atomic_ref_counting, N>* new_rrb = rrb_head_clone(in.ptr);
      leaf_node<T, atomic_ref_counting>* new_tail = leaf_node_inc(in->tail.ptr);
      new_tail->child[new_rrb->tail_len] = std::move(element);
      new_rrb->cnt++;
      new_rrb->tail_len++;
      new_rrb->tail = new_tail;
      return new_rrb;
      }